

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

void __thiscall cfd::core::Script::Script(Script *this,string *hex)

{
  ByteData data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ByteData local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  this->_vptr_Script = (_func_int **)&PTR__Script_00733828;
  ByteData::ByteData(&this->script_data_);
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  StringUtil::StringToByte(&local_30,(string *)hex);
  ByteData::ByteData(&local_48,&local_30);
  SetStackData(this,&local_48);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->script_data_,
             &local_48.data_);
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Script::Script(const std::string& hex) : script_data_(), script_stack_() {
  std::vector<uint8_t> buffer = StringUtil::StringToByte(hex);
  ByteData data = ByteData(buffer);
  SetStackData(data);
  script_data_ = data;
}